

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_accent_phrase.c
# Opt level: O3

void njd_set_accent_phrase(NJD *njd)

{
  NJDNode *node;
  int iVar1;
  char *pcVar2;
  int i;
  long lVar3;
  char cVar4;
  
  if ((njd != (NJD *)0x0) && (njd->head != (NJDNode *)0x0)) {
    for (node = njd->head->next; node != (NJDNode *)0x0; node = node->next) {
      iVar1 = NJDNode_get_chain_flag(node);
      if (iVar1 < 0) {
        NJDNode_set_chain_flag(node,1);
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12e4b7 + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12e4b7 + 0xd);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(node,1);
          }
        }
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12c098);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12e4b7 + 0xd);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12e4b7 + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group1(node->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12c0ae);
          if (iVar1 == 0) {
            pcVar2 = NJDNode_get_pos(node);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_12e4b7 + 0xd);
            if (iVar1 == 0) {
              NJDNode_set_chain_flag(node,0);
            }
          }
        }
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12d24d + 3);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12c098);
          if (iVar1 != 0) {
            pcVar2 = NJDNode_get_pos(node);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_12e4b7 + 0xd);
            if (iVar1 != 0) goto LAB_0014a29f;
          }
          NJDNode_set_chain_flag(node,0);
        }
LAB_0014a29f:
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12c0ce);
        if (iVar1 == 0) {
LAB_0014a348:
          NJDNode_set_chain_flag(node,0);
        }
        else {
          pcVar2 = NJDNode_get_pos(node->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12c0ce);
          if (iVar1 == 0) goto LAB_0014a348;
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12c0d8);
          if (iVar1 == 0) goto LAB_0014a348;
          pcVar2 = NJDNode_get_pos(node->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12c0d8);
          if (iVar1 == 0) goto LAB_0014a348;
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12c0e2);
          if (iVar1 == 0) goto LAB_0014a348;
          pcVar2 = NJDNode_get_pos(node->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12c0e2);
          if (iVar1 == 0) goto LAB_0014a348;
        }
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12e4b7 + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group1(node->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_128d2b);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12e4b7 + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group1(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_128d2b);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12e816 + 6);
        if (iVar1 == 0) {
          NJDNode_set_chain_flag(node,1);
        }
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12e33d + 10);
        if (iVar1 == 0) {
          NJDNode_set_chain_flag(node,1);
        }
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12e816 + 6);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12e816 + 6);
          if (iVar1 != 0) {
            pcVar2 = NJDNode_get_pos(node);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_12e33d + 10);
            if (iVar1 != 0) {
              NJDNode_set_chain_flag(node,0);
            }
          }
        }
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12e33d + 10);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12e816 + 6);
          if (iVar1 != 0) {
            pcVar2 = NJDNode_get_pos(node);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_12e33d + 10);
            if (iVar1 != 0) {
              NJDNode_set_chain_flag(node,0);
            }
          }
        }
        pcVar2 = NJDNode_get_pos_group1(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12c116);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12e4b7 + 0xd);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12c098);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group1(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12e56d + 7);
          if (iVar1 == 0) {
            pcVar2 = NJDNode_get_pos(node->prev);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_12d24d + 3);
            if (iVar1 == 0) {
              pcVar2 = NJDNode_get_cform(node->prev);
              cVar4 = -0x17;
              lVar3 = 0;
              do {
                if (pcVar2[lVar3] != cVar4) goto LAB_0014a4bf;
                cVar4 = anon_var_dwarf_12c12a[lVar3 + 1];
                lVar3 = lVar3 + 1;
              } while (lVar3 != 6);
            }
            else {
              pcVar2 = NJDNode_get_pos(node->prev);
              iVar1 = strcmp(pcVar2,anon_var_dwarf_12c098);
              if (iVar1 != 0) {
                pcVar2 = NJDNode_get_pos(node->prev);
                iVar1 = strcmp(pcVar2,anon_var_dwarf_12e33d + 10);
                if (iVar1 == 0) {
                  pcVar2 = NJDNode_get_pos_group1(node->prev);
                  iVar1 = strcmp(pcVar2,anon_var_dwarf_12e351 + 7);
                  if (iVar1 == 0) {
                    pcVar2 = NJDNode_get_string(node->prev);
                    iVar1 = strcmp(pcVar2,anon_var_dwarf_129a3c + 6);
                    if (iVar1 != 0) {
                      pcVar2 = NJDNode_get_string(node->prev);
                      iVar1 = strcmp(pcVar2,anon_var_dwarf_127e91);
                      if (iVar1 != 0) goto LAB_0014a4bf;
                    }
                    goto LAB_0014a899;
                  }
                }
                goto LAB_0014a4bf;
              }
              pcVar2 = NJDNode_get_cform(node->prev);
              cVar4 = -0x17;
              lVar3 = 0;
              do {
                if (pcVar2[lVar3] != cVar4) goto LAB_0014a4bf;
                cVar4 = anon_var_dwarf_12c12a[lVar3 + 1];
                lVar3 = lVar3 + 1;
              } while (lVar3 != 6);
            }
LAB_0014a899:
            NJDNode_set_chain_flag(node,1);
          }
        }
LAB_0014a4bf:
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12d24d + 3);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group1(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12e56d + 7);
          if (iVar1 == 0) {
            pcVar2 = NJDNode_get_pos(node->prev);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_12d24d + 3);
            if (iVar1 == 0) {
              pcVar2 = NJDNode_get_cform(node->prev);
              cVar4 = -0x17;
              lVar3 = 0;
              do {
                if (pcVar2[lVar3] != cVar4) goto LAB_0014a4f5;
                cVar4 = anon_var_dwarf_12c12a[lVar3 + 1];
                lVar3 = lVar3 + 1;
              } while (lVar3 != 6);
LAB_0014a861:
              NJDNode_set_chain_flag(node,1);
            }
            else {
              pcVar2 = NJDNode_get_pos(node->prev);
              iVar1 = strcmp(pcVar2,anon_var_dwarf_12e4b7 + 0xd);
              if (iVar1 == 0) {
                pcVar2 = NJDNode_get_pos_group1(node->prev);
                iVar1 = strcmp(pcVar2,anon_var_dwarf_12e465 + 7);
                if (iVar1 == 0) goto LAB_0014a861;
              }
            }
          }
        }
LAB_0014a4f5:
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12e4b7 + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12d24d + 3);
          if (iVar1 != 0) {
            pcVar2 = NJDNode_get_pos(node);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_12c098);
            if (iVar1 != 0) {
              pcVar2 = NJDNode_get_pos_group1(node);
              iVar1 = strcmp(pcVar2,anon_var_dwarf_12c0ae);
              if (iVar1 != 0) goto LAB_0014a560;
            }
          }
          NJDNode_set_chain_flag(node,0);
        }
LAB_0014a560:
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_1273ee);
        if (iVar1 == 0) {
LAB_0014a597:
          NJDNode_set_chain_flag(node,0);
        }
        else {
          pcVar2 = NJDNode_get_pos(node->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_1273ee);
          if (iVar1 == 0) goto LAB_0014a597;
        }
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12c172);
        if (iVar1 == 0) {
          NJDNode_set_chain_flag(node,0);
        }
        pcVar2 = NJDNode_get_pos_group3(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12c17c);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12e4b7 + 0xd);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12e4b7 + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group3(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_12e4c1 + 3);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar2 = NJDNode_get_pos_group1(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_12c116);
        if (iVar1 == 0) {
          NJDNode_set_chain_flag(node,1);
        }
      }
    }
  }
  return;
}

Assistant:

void njd_set_accent_phrase(NJD * njd)
{
   NJDNode *node;

   if (njd == NULL || njd->head == NULL)
      return;

   for (node = njd->head->next; node != NULL; node = node->next) {
      if (NJDNode_get_chain_flag(node) < 0) {
         /* Rule 01 */
         NJDNode_set_chain_flag(node, 1);

         /* Rule 02 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 1);

         /* Rule 03 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 04 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp
                (NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_PHRASE_KEIYOUDOUSHI_GOKAN) == 0)
               if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
                  NJDNode_set_chain_flag(node, 0);

         /* Rule 05 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0) {
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0)
               NJDNode_set_chain_flag(node, 0);
            else if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 0);
         }

         /* Rule 06 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_FUKUSHI) == 0
             || strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_FUKUSHI) == 0
             || strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_SETSUZOKUSHI) == 0
             || strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_SETSUZOKUSHI) == 0
             || strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_RENTAISHI) == 0
             || strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_RENTAISHI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 07 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_PHRASE_FUKUSHI_KANOU)
                == 0)
               NJDNode_set_chain_flag(node, 0);
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_FUKUSHI_KANOU) == 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 08 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JODOUSHI) == 0)
            NJDNode_set_chain_flag(node, 1);
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JOSHI) == 0)
            NJDNode_set_chain_flag(node, 1);

         /* Rule 09 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_JODOUSHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JODOUSHI) != 0 &&
                strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JOSHI) != 0)
               NJDNode_set_chain_flag(node, 0);
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_JOSHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JODOUSHI) != 0 &&
                strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JOSHI) != 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 10 */
         if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_PHRASE_SETSUBI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 11 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_HIJIRITSU) == 0) {
               if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0) {
                  if (strtopcmp(NJDNode_get_cform(node->prev), NJD_SET_ACCENT_PHRASE_RENYOU) != -1)
                     NJDNode_set_chain_flag(node, 1);
               } else if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_KEIYOUSHI)
                          == 0) {
                  if (strtopcmp(NJDNode_get_cform(node->prev), NJD_SET_ACCENT_PHRASE_RENYOU) != -1)
                     NJDNode_set_chain_flag(node, 1);
               } else if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_JOSHI) == 0) {
                  if (strcmp
                      (NJDNode_get_pos_group1(node->prev),
                       NJD_SET_ACCENT_PHRASE_SETSUZOKUJOSHI) == 0) {
                     if (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_PHRASE_TE) == 0)
                        NJDNode_set_chain_flag(node, 1);
                     else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_PHRASE_DE) == 0)
                        NJDNode_set_chain_flag(node, 1);
                  }
               }
            }

         /* Rule 12 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_HIJIRITSU) == 0) {
               if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0) {
                  if (strtopcmp(NJDNode_get_cform(node->prev), NJD_SET_ACCENT_PHRASE_RENYOU) != -1)
                     NJDNode_set_chain_flag(node, 1);
               } else if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0) {
                  if (strcmp
                      (NJDNode_get_pos_group1(node->prev),
                       NJD_SET_ACCENT_PHRASE_SAHEN_SETSUZOKU) == 0)
                     NJDNode_set_chain_flag(node, 1);
               }
            }

         /* Rule 13 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0) {
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0 ||
                strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0 ||
                strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_KEIYOUDOUSHI_GOKAN) == 0)
               NJDNode_set_chain_flag(node, 0);
         }

         /* Rule 14 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KIGOU) == 0 ||
             strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_KIGOU) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 15 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_SETTOUSHI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 16 */
         if (strcmp(NJDNode_get_pos_group3(node->prev), NJD_SET_ACCENT_PHRASE_SEI) == 0
             && strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 17 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0
             && strcmp(NJDNode_get_pos_group3(node), NJD_SET_ACCENT_PHRASE_MEI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 18 */
         if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_SETSUBI) == 0)
            NJDNode_set_chain_flag(node, 1);
      }
   }
}